

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrdrbg_test.cc
# Opt level: O1

void __thiscall CTRDRBGTest_Large_Test::TestBody(CTRDRBGTest_Large_Test *this)

{
  internal iVar1;
  int iVar2;
  uchar *out;
  pointer *__ptr_4;
  pointer *__ptr;
  char *message;
  char *in_R9;
  pointer *__ptr_5;
  AssertionResult gtest_ar;
  uint8_t kExpected [32];
  uint8_t digest [32];
  uint8_t kSeed [48];
  CTR_DRBG_STATE drbg;
  Message local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  Bytes local_1c8;
  long local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  string local_198;
  Bytes local_178;
  uint8_t local_168 [48];
  CTR_DRBG_STATE local_138;
  
  local_168[0x20] = '\0';
  local_168[0x21] = '\0';
  local_168[0x22] = '\0';
  local_168[0x23] = '\0';
  local_168[0x24] = '\0';
  local_168[0x25] = '\0';
  local_168[0x26] = '\0';
  local_168[0x27] = '\0';
  local_168[0x28] = '\0';
  local_168[0x29] = '\0';
  local_168[0x2a] = '\0';
  local_168[0x2b] = '\0';
  local_168[0x2c] = '\0';
  local_168[0x2d] = '\0';
  local_168[0x2e] = '\0';
  local_168[0x2f] = '\0';
  local_168[0x10] = '\0';
  local_168[0x11] = '\0';
  local_168[0x12] = '\0';
  local_168[0x13] = '\0';
  local_168[0x14] = '\0';
  local_168[0x15] = '\0';
  local_168[0x16] = '\0';
  local_168[0x17] = '\0';
  local_168[0x18] = '\0';
  local_168[0x19] = '\0';
  local_168[0x1a] = '\0';
  local_168[0x1b] = '\0';
  local_168[0x1c] = '\0';
  local_168[0x1d] = '\0';
  local_168[0x1e] = '\0';
  local_168[0x1f] = '\0';
  local_168[0] = '\0';
  local_168[1] = '\0';
  local_168[2] = '\0';
  local_168[3] = '\0';
  local_168[4] = '\0';
  local_168[5] = '\0';
  local_168[6] = '\0';
  local_168[7] = '\0';
  local_168[8] = '\0';
  local_168[9] = '\0';
  local_168[10] = '\0';
  local_168[0xb] = '\0';
  local_168[0xc] = '\0';
  local_168[0xd] = '\0';
  local_168[0xe] = '\0';
  local_168[0xf] = '\0';
  iVar2 = CTR_DRBG_init(&local_138,local_168,(uint8_t *)0x0,0);
  iVar1 = (internal)(iVar2 != 0);
  pbStack_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1b8._0_1_ = iVar1;
  if (iVar2 == 0) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_198,(internal *)&local_1b8,
               (AssertionResult *)"CTR_DRBG_init(&drbg, kSeed, nullptr, 0)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/rand/ctrdrbg_test.cc"
               ,0x4d,local_198._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_1d8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_1d8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1d8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_1d8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_1b0,pbStack_1b0);
    }
  }
  else {
    out = (uchar *)operator_new__(0x10000);
    memset(out,0,0x10000);
    iVar2 = CTR_DRBG_generate(&local_138,out,0x10000,(uint8_t *)0x0,0);
    local_1b8 = CONCAT71(local_1b8._1_7_,iVar2 != 0);
    pbStack_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message(&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_198,(internal *)&local_1b8,
                 (AssertionResult *)"CTR_DRBG_generate(&drbg, buf.get(), 65536, nullptr, 0)","false"
                 ,"true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/rand/ctrdrbg_test.cc"
                 ,0x51,local_198._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT71(local_1d8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_1d8.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_1d8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_1d8.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
      if (pbStack_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_1b0,pbStack_1b0);
      }
    }
    else {
      SHA256(out,0x10000,(uchar *)&local_198);
      local_1c8.span_.data_ = (uchar *)&local_1b8;
      local_1a8 = 0x6de3f43c58914ba0;
      uStack_1a0 = 0x2b1ca8f8b9bf41ff;
      local_1b8 = 0x6a3fc0ca96157869;
      pbStack_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    0x4975d0261e22ed6d;
      local_1c8.span_.size_ = 0x20;
      local_178.span_.size_ = 0x20;
      local_178.span_.data_ = (uchar *)&local_198;
      testing::internal::CmpHelperEQ<Bytes,Bytes>
                ((internal *)&local_1d8,"Bytes(kExpected)","Bytes(digest)",&local_1c8,&local_178);
      if (local_1d8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_1c8);
        if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_1d0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/rand/ctrdrbg_test.cc"
                   ,0x5b,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_1c8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
        if ((long *)local_1c8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_1c8.span_.data_ + 8))();
        }
      }
      if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d0,local_1d0);
      }
      CTR_DRBG_clear(&local_138);
    }
    operator_delete__(out);
  }
  return;
}

Assistant:

TEST(CTRDRBGTest, Large) {
  const uint8_t kSeed[CTR_DRBG_ENTROPY_LEN] = {0};

  CTR_DRBG_STATE drbg;
  ASSERT_TRUE(CTR_DRBG_init(&drbg, kSeed, nullptr, 0));

  auto buf = std::make_unique<uint8_t[]>(CTR_DRBG_MAX_GENERATE_LENGTH);
  ASSERT_TRUE(CTR_DRBG_generate(&drbg, buf.get(), CTR_DRBG_MAX_GENERATE_LENGTH,
                                nullptr, 0));

  uint8_t digest[SHA256_DIGEST_LENGTH];
  SHA256(buf.get(), CTR_DRBG_MAX_GENERATE_LENGTH, digest);

  const uint8_t kExpected[SHA256_DIGEST_LENGTH] = {
      0x69, 0x78, 0x15, 0x96, 0xca, 0xc0, 0x3f, 0x6a, 0x6d, 0xed, 0x22,
      0x1e, 0x26, 0xd0, 0x75, 0x49, 0xa0, 0x4b, 0x91, 0x58, 0x3c, 0xf4,
      0xe3, 0x6d, 0xff, 0x41, 0xbf, 0xb9, 0xf8, 0xa8, 0x1c, 0x2b,
  };
  EXPECT_EQ(Bytes(kExpected), Bytes(digest));

  CTR_DRBG_clear(&drbg);
}